

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

wchar_t utf8_ptr::s_getch_before(char *p,size_t ofs)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  long in_RSI;
  char *in_RDI;
  long local_10;
  char *local_8;
  
  local_8 = in_RDI;
  for (local_10 = in_RSI; local_10 != 0; local_10 = local_10 + -1) {
    local_8 = local_8 + -1;
    iVar1 = s_is_continuation(local_8);
    iVar2 = s_is_continuation(local_8 + -(long)iVar1);
    local_8 = local_8 + -(long)iVar1 + -(long)iVar2;
  }
  wVar3 = s_getch(local_8);
  return wVar3;
}

Assistant:

static wchar_t s_getch_before(const char *p, size_t ofs)
    {
        /* skip backwards the given number of characters */
        for ( ; ofs != 0 ; --ofs)
        {
            /* 
             *   back up by one to three bytes, until we find no more
             *   continuation flags 
             */
            --p;
            p -= s_is_continuation(p);
            p -= s_is_continuation(p);
        }
        
        /* return the character at the current position */
        return s_getch(p);
    }